

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matd.c
# Opt level: O2

void matd_print(matd_t *m,char *fmt)

{
  int j;
  uint uVar1;
  int i;
  uint uVar2;
  
  if (m == (matd_t *)0x0) {
    __assert_fail("m != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                  ,0xbb,"void matd_print(const matd_t *, const char *)");
  }
  if (fmt != (char *)0x0) {
    if ((m->ncols < 2) && (m->nrows < 2)) {
      printf(fmt,m[1]);
      putchar(10);
      return;
    }
    for (uVar2 = 0; uVar2 < m->nrows; uVar2 = uVar2 + 1) {
      for (uVar1 = 0; uVar1 < m->ncols; uVar1 = uVar1 + 1) {
        printf(fmt,m[(ulong)(m->ncols * uVar2 + uVar1) + 1]);
      }
      putchar(10);
    }
    return;
  }
  __assert_fail("fmt != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                ,0xbc,"void matd_print(const matd_t *, const char *)");
}

Assistant:

void matd_print(const matd_t *m, const char *fmt)
{
    assert(m != NULL);
    assert(fmt != NULL);

    if (matd_is_scalar(m)) {
        printf(fmt, MATD_EL(m, 0, 0));
        printf("\n");
    } else {
        for (int i = 0; i < m->nrows; i++) {
            for (int j = 0; j < m->ncols; j++) {
                printf(fmt, MATD_EL(m, i, j));
            }
            printf("\n");
        }
    }
}